

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

bool jsonip::parser::plus_<jsonip::parser::digit_>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  bool bVar1;
  bool local_19;
  ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state_local;
  
  bVar1 = cirange_<(char)48,(char)57>::
          match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state);
  if (bVar1) {
    do {
      bVar1 = cirange_<(char)48,(char)57>::
              match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                        (state);
      local_19 = false;
      if (bVar1) {
        bVar1 = cirange_<(char)48,(char)57>::
                match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                          (state);
        local_19 = false;
        if (bVar1) {
          bVar1 = cirange_<(char)48,(char)57>::
                  match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                            (state);
          local_19 = false;
          if (bVar1) {
            bVar1 = cirange_<(char)48,(char)57>::
                    match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                              (state);
            local_19 = false;
            if (bVar1) {
              bVar1 = cirange_<(char)48,(char)57>::
                      match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                                (state);
              local_19 = false;
              if (bVar1) {
                bVar1 = cirange_<(char)48,(char)57>::
                        match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                                  (state);
                local_19 = false;
                if (bVar1) {
                  bVar1 = cirange_<(char)48,(char)57>::
                          match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                                    (state);
                  local_19 = false;
                  if (bVar1) {
                    bVar1 = cirange_<(char)48,(char)57>::
                            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                                      (state);
                    local_19 = false;
                    if (bVar1) {
                      bVar1 = cirange_<(char)48,(char)57>::
                              match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                                        (state);
                      local_19 = false;
                      if (bVar1) {
                        local_19 = cirange_<(char)48,(char)57>::
                                   match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                                             (state);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    } while (local_19 != false);
    state_local._7_1_ = true;
  }
  else {
    state_local._7_1_ = false;
  }
  return state_local._7_1_;
}

Assistant:

static inline bool match(S& state)
        {
            if (!C0::match(state)) return false;
            // Note: yes, I unroll this loop intentionally
            while (C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state))
                ;
            return true;
        }